

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementShellBST::ComputeNF(ChElementShellBST *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeNF((ChElementShellBST *)(this[-1].e.m_data + 2),in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_RSI,
            in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void ChElementShellBST::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

	detJ = GetThickness() * this->area; 
	// simplified from: 
	//   detJ = GetThickness() * this->area * 2 * 1/2
	// where ..* 2  stems from the fact that for triangles in natural coordinates [0..+1] the det_tri[J] is area*2
	// where ..*1/2 stems from the fact that the thickness integration runs in [-1..+1], so det_thick[J] is thickness*1/2

	Qi.setZero();

    Qi.segment(0,3) = N(0) * F.segment(0,3);

    Qi.segment(3, 3) = N(1) * F.segment(0, 3);

    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}